

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFOBSFireFightingFactored.cpp
# Opt level: O0

void __thiscall
ProblemFOBSFireFightingFactored::ProblemFOBSFireFightingFactored
          (ProblemFOBSFireFightingFactored *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,
          double costOfMove,bool forcePositionRepres,bool initialize)

{
  long in_RCX;
  long in_RDX;
  allocator<char> *in_RSI;
  long *in_RDI;
  DecPOMDPDiscreteInterface *this_00;
  byte in_R8B;
  byte in_R9B;
  long in_XMM0_Qa;
  ProblemFOBSFireFightingFactored *in_stack_000003f0;
  allocator<char> *__a;
  MultiAgentDecisionProcessDiscreteInterface *this_01;
  pointer_____offset_0x70___ *this_02;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [16];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  void **in_stack_ffffffffffffffa8;
  FactoredMMDPDiscrete *in_stack_ffffffffffffffb0;
  
  this_00 = (DecPOMDPDiscreteInterface *)(in_RDI + 0xee);
  __a = in_RSI;
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  this_02 = &VTT;
  POSGInterface::POSGInterface((POSGInterface *)this_00,&PTR_PTR_00d24420);
  DecPOMDPInterface::DecPOMDPInterface
            ((DecPOMDPInterface *)this_00,
             (void **)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)this_02 + 0x180))->_M_string_length);
  this_01 = (MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0xef);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            (this_01,(void **)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)this_02 + 0x1a0))->field_2)._M_allocated_capacity);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface(this_00,(void **)((long)this_02 + 0x160));
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface::
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface
            ((MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)this_01,
             (void **)((long)this_02 + 0x1c0));
  FactoredDecPOMDPDiscreteInterface::FactoredDecPOMDPDiscreteInterface
            ((FactoredDecPOMDPDiscreteInterface *)this_00,
             (void **)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)this_02 + 0x120))->_M_string_length);
  *in_RDI = 0xd23708;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xef] = 0xd24068;
  in_RDI[0xef] = 0xd24068;
  in_RDI[0xc0] = 0xd23b00;
  (**(code **)(*in_RDI + 0x328))(&stack0xffffffffffffffb0,in_RDI,in_RSI,in_RDX,in_RCX);
  (**(code **)(*in_RDI + 0x330))(local_80,in_RDI,in_RSI,in_RDX,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
             (char *)this_01,__a);
  FactoredMMDPDiscrete::FactoredMMDPDiscrete
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  *in_RDI = 0xd23708;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xee] = 0xd23d00;
  in_RDI[0xef] = 0xd24068;
  in_RDI[0xef] = 0xd24068;
  in_RDI[0xc0] = 0xd23b00;
  in_RDI[0xe1] = (long)in_RSI;
  in_RDI[0xe2] = in_RDX;
  in_RDI[0xe3] = in_RCX;
  in_RDI[0xe4] = in_XMM0_Qa;
  *(byte *)(in_RDI + 0xe5) = in_R8B & 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9a5cf9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9a5d0f);
  if ((in_R9B & 1) != 0) {
    InitializePFFF(in_stack_000003f0);
  }
  return;
}

Assistant:

ProblemFOBSFireFightingFactored::ProblemFOBSFireFightingFactored(
    size_t nrAgents, size_t nrHouses, size_t nrFLs,
    double costOfMove, bool forcePositionRepres, bool initialize)
        :
        FactoredMMDPDiscrete(
            SoftPrintBriefDescription(nrAgents, nrHouses, nrFLs),
            SoftPrintDescription(nrAgents, nrHouses, nrFLs),
            "none"),
        _m_nrAgents(nrAgents),
        _m_nrHouses(nrHouses),
        _m_nrFireLevels(nrFLs),
        _m_costOfMove(costOfMove),
        _m_forcePositionRepres(forcePositionRepres)
{
    if(initialize)
        InitializePFFF();
}